

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::_PathArcToN
          (ImDrawList *this,ImVec2 *center,float radius,float a_min,float a_max,int num_segments)

{
  float fVar1;
  float fVar2;
  ImVec2 *pIVar3;
  ImVec2 IVar4;
  ImVec2 *pIVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  float fVar10;
  float fVar11;
  
  iVar8 = (this->_Path).Size;
  if (0.5 <= radius) {
    iVar8 = num_segments + iVar8 + 1;
    if ((this->_Path).Capacity < iVar8) {
      pIVar5 = (ImVec2 *)ImGui::MemAlloc((long)iVar8 << 3);
      pIVar3 = (this->_Path).Data;
      if (pIVar3 != (ImVec2 *)0x0) {
        memcpy(pIVar5,pIVar3,(long)(this->_Path).Size << 3);
        ImGui::MemFree((this->_Path).Data);
      }
      (this->_Path).Data = pIVar5;
      (this->_Path).Capacity = iVar8;
    }
    if (-1 < num_segments) {
      iVar8 = 0;
      do {
        fVar11 = ((float)iVar8 / (float)num_segments) * (a_max - a_min) + a_min;
        fVar1 = center->x;
        fVar10 = cosf(fVar11);
        fVar2 = center->y;
        fVar11 = sinf(fVar11);
        iVar9 = (this->_Path).Size;
        iVar6 = (this->_Path).Capacity;
        if (iVar9 == iVar6) {
          if (iVar6 == 0) {
            iVar7 = 8;
          }
          else {
            iVar7 = iVar6 / 2 + iVar6;
          }
          iVar9 = iVar9 + 1;
          if (iVar9 < iVar7) {
            iVar9 = iVar7;
          }
          if (iVar6 < iVar9) {
            pIVar5 = (ImVec2 *)ImGui::MemAlloc((long)iVar9 << 3);
            pIVar3 = (this->_Path).Data;
            if (pIVar3 != (ImVec2 *)0x0) {
              memcpy(pIVar5,pIVar3,(long)(this->_Path).Size << 3);
              ImGui::MemFree((this->_Path).Data);
            }
            (this->_Path).Data = pIVar5;
            (this->_Path).Capacity = iVar9;
          }
        }
        IVar4.y = fVar2 + fVar11 * radius;
        IVar4.x = fVar1 + fVar10 * radius;
        (this->_Path).Data[(this->_Path).Size] = IVar4;
        (this->_Path).Size = (this->_Path).Size + 1;
        iVar8 = iVar8 + 1;
      } while (num_segments + 1 != iVar8);
    }
  }
  else {
    iVar9 = (this->_Path).Capacity;
    if (iVar8 == iVar9) {
      if (iVar9 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar9 / 2 + iVar9;
      }
      iVar7 = iVar8 + 1;
      if (iVar8 + 1 < iVar6) {
        iVar7 = iVar6;
      }
      if (iVar9 < iVar7) {
        pIVar5 = (ImVec2 *)ImGui::MemAlloc((long)iVar7 << 3);
        pIVar3 = (this->_Path).Data;
        if (pIVar3 != (ImVec2 *)0x0) {
          memcpy(pIVar5,pIVar3,(long)(this->_Path).Size << 3);
          ImGui::MemFree((this->_Path).Data);
        }
        (this->_Path).Data = pIVar5;
        (this->_Path).Capacity = iVar7;
      }
    }
    (this->_Path).Data[(this->_Path).Size] = *center;
    (this->_Path).Size = (this->_Path).Size + 1;
  }
  return;
}

Assistant:

void ImDrawList::_PathArcToN(const ImVec2& center, float radius, float a_min, float a_max, int num_segments)
{
    if (radius < 0.5f)
    {
        _Path.push_back(center);
        return;
    }

    // Note that we are adding a point at both a_min and a_max.
    // If you are trying to draw a full closed circle you don't want the overlapping points!
    _Path.reserve(_Path.Size + (num_segments + 1));
    for (int i = 0; i <= num_segments; i++)
    {
        const float a = a_min + ((float)i / (float)num_segments) * (a_max - a_min);
        _Path.push_back(ImVec2(center.x + ImCos(a) * radius, center.y + ImSin(a) * radius));
    }
}